

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O2

double __thiscall NEST::LArNEST::GetNRPhotonYields(LArNEST *this,double energy,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  dVar1 = (this->fNR).alpha;
  dVar3 = pow(energy,(this->fNR).beta);
  dVar2 = (this->fNR).gamma;
  dVar4 = pow(efield,(this->fNR).delta);
  dVar6 = energy + (this->fNR).epsilon;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  auVar5._8_8_ = dVar6;
  auVar5._0_8_ = dVar4 * dVar2;
  auVar5 = divpd(_DAT_001177b0,auVar5);
  return dVar1 * dVar3 + auVar5._8_8_ * auVar5._0_8_;
}

Assistant:

double LArNEST::GetNRPhotonYields(double energy, double efield) {
  return fNR.alpha * pow(energy, fNR.beta) -
         (1.0 / (fNR.gamma * pow(efield, fNR.delta))) *
             (1.0 / sqrt(energy + fNR.epsilon));
}